

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filters.cpp
# Opt level: O0

void __thiscall
helics::CloningFilter::setString(CloningFilter *this,string_view property,string_view val)

{
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  string_view newTarget;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_03;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_04;
  string_view newTarget_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_05;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_06;
  string_view newTarget_01;
  string_view newTarget_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_07;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_08;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_09;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_10;
  string_view targetToRemove;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  basic_string_view<char,_std::char_traits<char>_> __x_03;
  basic_string_view<char,_std::char_traits<char>_> __x_04;
  basic_string_view<char,_std::char_traits<char>_> __x_05;
  basic_string_view<char,_std::char_traits<char>_> __x_06;
  basic_string_view<char,_std::char_traits<char>_> __x_07;
  basic_string_view<char,_std::char_traits<char>_> __x_08;
  basic_string_view<char,_std::char_traits<char>_> __x_09;
  basic_string_view<char,_std::char_traits<char>_> __x_10;
  string_view val_00;
  bool bVar1;
  Filter *in_RDX;
  char *in_stack_fffffffffffffde8;
  InterfaceType hint;
  Interface *in_stack_fffffffffffffdf0;
  size_t in_stack_fffffffffffffdf8;
  char *in_stack_fffffffffffffe00;
  size_t in_stack_fffffffffffffe08;
  char *in_stack_fffffffffffffe10;
  string_view in_stack_fffffffffffffe18;
  
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffdf0,
             in_stack_fffffffffffffde8);
  __x._M_str = in_stack_fffffffffffffe10;
  __x._M_len = in_stack_fffffffffffffe08;
  __y._M_str = in_stack_fffffffffffffe00;
  __y._M_len = in_stack_fffffffffffffdf8;
  bVar1 = std::operator==(__x,__y);
  if (!bVar1) {
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffdf0,
               in_stack_fffffffffffffde8);
    __x_00._M_str = in_stack_fffffffffffffe10;
    __x_00._M_len = in_stack_fffffffffffffe08;
    __y_00._M_str = in_stack_fffffffffffffe00;
    __y_00._M_len = in_stack_fffffffffffffdf8;
    bVar1 = std::operator==(__x_00,__y_00);
    if (!bVar1) {
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffdf0,
                 in_stack_fffffffffffffde8);
      __x_01._M_str = in_stack_fffffffffffffe10;
      __x_01._M_len = in_stack_fffffffffffffe08;
      __y_01._M_str = in_stack_fffffffffffffe00;
      __y_01._M_len = in_stack_fffffffffffffdf8;
      bVar1 = std::operator==(__x_01,__y_01);
      if (!bVar1) {
        CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffdf0,
                   in_stack_fffffffffffffde8);
        __x_02._M_str = in_stack_fffffffffffffe10;
        __x_02._M_len = in_stack_fffffffffffffe08;
        __y_02._M_str = in_stack_fffffffffffffe00;
        __y_02._M_len = in_stack_fffffffffffffdf8;
        bVar1 = std::operator==(__x_02,__y_02);
        if (!bVar1) {
          CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffdf0,
                     in_stack_fffffffffffffde8);
          __x_03._M_str = in_stack_fffffffffffffe10;
          __x_03._M_len = in_stack_fffffffffffffe08;
          __y_03._M_str = in_stack_fffffffffffffe00;
          __y_03._M_len = in_stack_fffffffffffffdf8;
          bVar1 = std::operator==(__x_03,__y_03);
          if (!bVar1) {
            CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffdf0
                       ,in_stack_fffffffffffffde8);
            __x_04._M_str = in_stack_fffffffffffffe10;
            __x_04._M_len = in_stack_fffffffffffffe08;
            __y_04._M_str = in_stack_fffffffffffffe00;
            __y_04._M_len = in_stack_fffffffffffffdf8;
            bVar1 = std::operator==(__x_04,__y_04);
            if (!bVar1) {
              CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
              __x_05._M_str = in_stack_fffffffffffffe10;
              __x_05._M_len = in_stack_fffffffffffffe08;
              __y_05._M_str = in_stack_fffffffffffffe00;
              __y_05._M_len = in_stack_fffffffffffffdf8;
              bVar1 = std::operator==(__x_05,__y_05);
              if (!bVar1) {
                CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          ((basic_string_view<char,_std::char_traits<char>_> *)
                           in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
                __x_06._M_str = in_stack_fffffffffffffe10;
                __x_06._M_len = in_stack_fffffffffffffe08;
                __y_06._M_str = in_stack_fffffffffffffe00;
                __y_06._M_len = in_stack_fffffffffffffdf8;
                bVar1 = std::operator==(__x_06,__y_06);
                if (!bVar1) {
                  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                            ((basic_string_view<char,_std::char_traits<char>_> *)
                             in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
                  __x_07._M_str = in_stack_fffffffffffffe10;
                  __x_07._M_len = in_stack_fffffffffffffe08;
                  __y_07._M_str = in_stack_fffffffffffffe00;
                  __y_07._M_len = in_stack_fffffffffffffdf8;
                  bVar1 = std::operator==(__x_07,__y_07);
                  if (!bVar1) {
                    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                              ((basic_string_view<char,_std::char_traits<char>_> *)
                               in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
                    __x_08._M_str = in_stack_fffffffffffffe10;
                    __x_08._M_len = in_stack_fffffffffffffe08;
                    __y_08._M_str = in_stack_fffffffffffffe00;
                    __y_08._M_len = in_stack_fffffffffffffdf8;
                    bVar1 = std::operator==(__x_08,__y_08);
                    if (!bVar1) {
                      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                                ((basic_string_view<char,_std::char_traits<char>_> *)
                                 in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
                      __x_09._M_str = in_stack_fffffffffffffe10;
                      __x_09._M_len = in_stack_fffffffffffffe08;
                      __y_09._M_str = in_stack_fffffffffffffe00;
                      __y_09._M_len = in_stack_fffffffffffffdf8;
                      bVar1 = std::operator==(__x_09,__y_09);
                      if (!bVar1) {
                        CLI::std::basic_string_view<char,_std::char_traits<char>_>::
                        basic_string_view((basic_string_view<char,_std::char_traits<char>_> *)
                                          in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
                        __x_10._M_str = in_stack_fffffffffffffe10;
                        __x_10._M_len = in_stack_fffffffffffffe08;
                        __y_10._M_str = in_stack_fffffffffffffe00;
                        __y_10._M_len = in_stack_fffffffffffffdf8;
                        bVar1 = std::operator==(__x_10,__y_10);
                        if (!bVar1) {
                          val_00._M_str = in_stack_fffffffffffffe10;
                          val_00._M_len = in_stack_fffffffffffffe08;
                          Filter::setString(in_RDX,in_stack_fffffffffffffe18,val_00);
                          return;
                        }
                      }
                    }
                  }
                  targetToRemove._M_str = in_stack_fffffffffffffe00;
                  targetToRemove._M_len = in_stack_fffffffffffffdf8;
                  Interface::removeTarget(in_stack_fffffffffffffdf0,targetToRemove);
                  return;
                }
              }
              newTarget_01._M_str = in_stack_fffffffffffffe00;
              newTarget_01._M_len = in_stack_fffffffffffffdf8;
              hint = (InterfaceType)((ulong)in_stack_fffffffffffffde8 >> 0x38);
              Interface::addSourceTarget(in_stack_fffffffffffffdf0,newTarget_01,hint);
              newTarget_02._M_str = in_stack_fffffffffffffe00;
              newTarget_02._M_len = in_stack_fffffffffffffdf8;
              Interface::addDestinationTarget(in_stack_fffffffffffffdf0,newTarget_02,hint);
              return;
            }
          }
        }
      }
      newTarget_00._M_str = in_stack_fffffffffffffe00;
      newTarget_00._M_len = in_stack_fffffffffffffdf8;
      Interface::addDestinationTarget
                (in_stack_fffffffffffffdf0,newTarget_00,
                 (InterfaceType)((ulong)in_stack_fffffffffffffde8 >> 0x38));
      return;
    }
  }
  newTarget._M_str = in_stack_fffffffffffffe00;
  newTarget._M_len = in_stack_fffffffffffffdf8;
  Interface::addSourceTarget
            (in_stack_fffffffffffffdf0,newTarget,
             (InterfaceType)((ulong)in_stack_fffffffffffffde8 >> 0x38));
  return;
}

Assistant:

void CloningFilter::setString(std::string_view property, std::string_view val)
{
    if ((property == "source") || (property == "add source")) {
        addSourceTarget(val);
    } else if (property == "dest" || property == "destination" || property == "add destination" ||
               property == "add dest") {
        addDestinationTarget(val);
    } else if (property == "endpoint" || property == "add endpoint") {
        addSourceTarget(val);
        addDestinationTarget(val);
    } else if (property == "remove destination" || property == "remove dest" ||
               property == "remove source" || property == "remove endpoint") {
        removeTarget(val);
    } else {
        Filter::setString(property, val);
    }
}